

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

void __thiscall QInputDialog::setComboBoxEditable(QInputDialog *this,bool editable)

{
  QInputDialogPrivate *this_00;
  long lVar1;
  long lVar2;
  
  this_00 = *(QInputDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QInputDialogPrivate::ensureComboBox(this_00);
  QComboBox::setEditable(this_00->comboBox,editable);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 800);
  if ((lVar2 != 0) && ((lVar2 == *(long *)(lVar1 + 0x300) || (lVar2 == *(long *)(lVar1 + 0x308)))))
  {
    return;
  }
  QInputDialogPrivate::chooseRightTextInputWidget(this_00);
  return;
}

Assistant:

void QInputDialog::setComboBoxEditable(bool editable)
{
    Q_D(QInputDialog);
    d->ensureComboBox();
    d->comboBox->setEditable(editable);
    if (inputMode() == TextInput)
        d->chooseRightTextInputWidget();
}